

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

void __thiscall mir::inst::BasicBlk::BasicBlk(BasicBlk *this,BasicBlk *param_2)

{
  JumpInstruction *in_RSI;
  JumpInstruction *in_RDI;
  
  prelude::Displayable::Displayable(&in_RDI->super_Displayable,&in_RSI->super_Displayable);
  *(undefined ***)&((_Rep_type *)&in_RDI->super_Displayable)->_M_impl = &PTR_display_003704a0;
  (((_Rb_tree_header *)&in_RDI->kind)->_M_header)._M_color =
       (((_Rb_tree_header *)&in_RSI->kind)->_M_header)._M_color;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_RSI,
             (set<int,_std::less<int>,_std::allocator<int>_> *)in_RDI);
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::vector((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            *)in_RSI,
           (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
            *)in_RDI);
  JumpInstruction::JumpInstruction(in_RSI,in_RDI);
  return;
}

Assistant:

BasicBlk(BasicBlk&&) = default;